

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O2

Shrinkables<int> * __thiscall
rc::gen::detail::generateShrinkables<int,rc::fn::Constant<bool>>
          (Shrinkables<int> *__return_storage_ptr__,detail *this,Random *random,int size,
          size_t count,Gen<int> *gen,Constant<bool> predicate)

{
  GenerationFailure *this_00;
  undefined4 in_register_0000000c;
  size_type __n;
  long lVar1;
  int iVar2;
  Random *pRVar3;
  Shrinkable<int> shrinkable;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Random local_e0;
  Random r;
  
  __n = CONCAT44(in_register_0000000c,size);
  pRVar3 = &r;
  for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pRVar3->m_key)._M_elems[0] = *(unsigned_long *)this;
    this = this + 8;
    pRVar3 = (Random *)((pRVar3->m_key)._M_elems + 1);
  }
  (__return_storage_ptr__->
  super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>::reserve
            (__return_storage_ptr__,__n);
  iVar2 = 0;
  do {
    if (__n <= (ulong)((long)(__return_storage_ptr__->
                             super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(__return_storage_ptr__->
                             super__Vector_base<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3)) {
      return __return_storage_ptr__;
    }
    Random::split(&local_e0,&r);
    Gen<int>::operator()((Gen<int> *)&shrinkable,(Random *)count,(int)&local_e0);
    if (((ulong)gen & 1) == 0) {
      if (0x62 < iVar2) {
        this_00 = (GenerationFailure *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_120,__n);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e0,"Gave up trying to generate ",&local_120);
        std::operator+(&local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e0," values for container");
        GenerationFailure::GenerationFailure(this_00,&local_100);
        __cxa_throw(this_00,&GenerationFailure::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar2 = iVar2 + 1;
    }
    else {
      iVar2 = 0;
      std::vector<rc::Shrinkable<int>,std::allocator<rc::Shrinkable<int>>>::
      emplace_back<rc::Shrinkable<int>>
                ((vector<rc::Shrinkable<int>,std::allocator<rc::Shrinkable<int>>> *)
                 __return_storage_ptr__,&shrinkable);
    }
    Shrinkable<int>::~Shrinkable(&shrinkable);
  } while( true );
}

Assistant:

Shrinkables<T> generateShrinkables(const Random &random,
                                   int size,
                                   std::size_t count,
                                   const Gen<T> &gen,
                                   Predicate predicate) {
  Random r(random);
  Shrinkables<T> shrinkables;
  shrinkables.reserve(count);

  auto currentSize = size;
  int tries = 0;
  while (shrinkables.size() < count) {
    auto shrinkable = gen(r.split(), currentSize);
    if (predicate(shrinkable)) {
      shrinkables.push_back(std::move(shrinkable));
      tries = 0;
    } else {
      tries++;
      if (tries >= 100) {
        // TODO magic constant!
        throw GenerationFailure("Gave up trying to generate " +
                                std::to_string(count) +
                                " values for container");
      }
      currentSize++;
    }
  }

  return shrinkables;
}